

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrapTCPService.cpp
# Opt level: O3

PTR brynet::net::TCPSession::Create(void)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  element_type *peVar1;
  element_type *in_RDI;
  PTR PVar2;
  
  peVar1 = (element_type *)operator_new(0xb0);
  (peVar1->super_enable_shared_from_this<brynet::net::TcpService>)._M_weak_this.
  super___weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x100000001;
  peVar1->_vptr_TcpService = (_func_int **)&PTR___Sp_counted_ptr_inplace_00147e50;
  *(undefined8 *)((long)&(peVar1->mIOLoopGuard).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(peVar1->mIOLoopGuard).super___mutex_base._M_mutex + 0x10) = 0;
  (peVar1->mIOLoopDatas).
  super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (peVar1->mIOLoopGuard).super___mutex_base._M_mutex.__align = 0;
  (peVar1->mIOLoopGuard).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (peVar1->mIOLoopGuard).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (peVar1->mRunIOLoop).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  *(undefined1 **)((long)&(peVar1->mIOLoopGuard).super___mutex_base._M_mutex + 0x10) =
       (undefined1 *)((long)&(peVar1->mIOLoopGuard).super___mutex_base._M_mutex + 0x20);
  (peVar1->mRunIOLoop).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (peVar1->mServiceGuard).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(peVar1->mServiceGuard).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(peVar1->mServiceGuard).super___mutex_base._M_mutex + 0x10) = 0;
  (peVar1->mServiceGuard).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (peVar1->mServiceGuard).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  peVar1[1]._vptr_TcpService = (_func_int **)0x0;
  peVar1[1].super_enable_shared_from_this<brynet::net::TcpService>._M_weak_this.
  super___weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  peVar1[1].super_enable_shared_from_this<brynet::net::TcpService>._M_weak_this.
  super___weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1[1].mIOLoopDatas.
  super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined8 *)((long)&(peVar1->mIOLoopGuard).super___mutex_base._M_mutex + 8) =
       0xffffffffffffffff;
  (peVar1->mIOLoopDatas).
  super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (peVar1->mIOLoopDatas).
  super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (peVar1->super_enable_shared_from_this<brynet::net::TcpService>)._M_weak_this.
  super___weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__TCPSession_00147ea0;
  in_RDI->_vptr_TCPSession =
       (_func_int **)
       &(peVar1->super_enable_shared_from_this<brynet::net::TcpService>)._M_weak_this.
        super___weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  (in_RDI->mService).super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar1;
  PVar2.super___shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__TCPSession_00147ea0;
  PVar2.super___shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (PTR)PVar2.super___shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TCPSession::PTR TCPSession::Create()
{
    struct make_shared_enabler : public TCPSession {};
    return std::make_shared<make_shared_enabler>();
}